

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall wasm::TranslateToFuzzReader::makeStringConcat(TranslateToFuzzReader *this)

{
  StringConcat *pSVar1;
  HeapType local_30;
  Expression *local_28;
  Expression *right;
  Expression *local_18;
  Expression *left;
  TranslateToFuzzReader *this_local;
  
  left = (Expression *)this;
  HeapType::HeapType((HeapType *)&right,string);
  local_18 = makeTrappingRefUse(this,(HeapType)right);
  HeapType::HeapType(&local_30,string);
  local_28 = makeTrappingRefUse(this,local_30);
  pSVar1 = Builder::makeStringConcat(&this->builder,local_18,local_28);
  return (Expression *)pSVar1;
}

Assistant:

Expression* TranslateToFuzzReader::makeStringConcat() {
  auto* left = makeTrappingRefUse(HeapType::string);
  auto* right = makeTrappingRefUse(HeapType::string);
  return builder.makeStringConcat(left, right);
}